

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O3

void hexToByte(string *hex,BYTE *out)

{
  uint uVar1;
  long *__nptr;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  uint uVar7;
  long *__nptr_00;
  long *local_70;
  ulong local_68;
  BYTE *local_60;
  string *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar1 = (uint)hex->_M_string_length;
  local_68 = (ulong)uVar1;
  local_60 = out;
  local_58 = hex;
  if (1 < (int)uVar1) {
    uVar6 = 0;
    do {
      std::__cxx11::string::substr((ulong)local_50,(ulong)local_58);
      __nptr_00 = local_50[0];
      puVar2 = (uint *)__errno_location();
      uVar7 = *puVar2;
      puVar4 = (uint *)(ulong)uVar7;
      *puVar2 = 0;
      lVar3 = strtol((char *)__nptr_00,(char **)&local_70,0x10);
      if (local_70 == __nptr_00) {
        std::__throw_invalid_argument("stoi");
LAB_001140cb:
        std::__throw_out_of_range("stoi");
        goto LAB_001140d7;
      }
      if ((lVar3 - 0x80000000U < 0xffffffff00000000) || (*puVar2 == 0x22)) goto LAB_001140cb;
      if (*puVar2 == 0) {
        *puVar2 = uVar7;
      }
      local_60[uVar6] = (BYTE)lVar3;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      uVar6 = uVar6 + 1;
    } while ((uint)((int)uVar1 / 2) != uVar6);
  }
  if ((local_68 & 1) == 0) {
    return;
  }
  std::__cxx11::string::substr((ulong)local_50,(ulong)local_58);
  __nptr = local_50[0];
  puVar4 = (uint *)__errno_location();
  uVar7 = *puVar4;
  __nptr_00 = (long *)(ulong)uVar7;
  *puVar4 = 0;
  lVar3 = strtol((char *)__nptr,(char **)&local_70,0x10);
  if (local_70 == __nptr) {
LAB_001140d7:
    uVar7 = (uint)__nptr_00;
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar3 == lVar3) && (*puVar4 != 0x22)) {
    if (*puVar4 == 0) {
      *puVar4 = uVar7;
    }
    local_60[(int)uVar1 / 2] = (BYTE)lVar3;
    if (local_50[0] == local_40) {
      return;
    }
    operator_delete(local_50[0],local_40[0] + 1);
    return;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (*puVar4 == 0) {
    *puVar4 = uVar7;
  }
  hexToByte();
  _Unwind_Resume(uVar5);
}

Assistant:

void hexToByte(string hex, BYTE* out) {
	int length = hex.length();
	for (int i = 0; i < length / 2; i++) {
		out[i] = stoi(hex.substr(length - 2 - i * 2, 2), 0, 16);
	}
	if ((length & 1) != 0)
		out[length / 2] = stoi(hex.substr(0, 1), 0, 16);
}